

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::ConvolutionLayerParams::ByteSizeLong(ConvolutionLayerParams *this)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  size_t sVar10;
  int iVar11;
  
  uVar3 = (this->kernelsize_).current_size_;
  uVar6 = 0;
  if ((int)uVar3 < 1) {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    do {
      puVar4 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->kernelsize_,(int)uVar6);
      lVar8 = 0x3f;
      if ((*puVar4 | 1) != 0) {
        for (; (*puVar4 | 1) >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      lVar7 = lVar7 + (ulong)((int)lVar8 * 9 + 0x49U >> 6);
      uVar9 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar9;
    } while (uVar3 != uVar9);
    if (lVar7 == 0) {
      lVar7 = 0;
      uVar6 = 0;
    }
    else if ((int)(uint)lVar7 < 0) {
      uVar6 = 0xc;
    }
    else {
      uVar3 = (uint)lVar7 | 1;
      iVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 2);
    }
  }
  this->_kernelsize_cached_byte_size_ = (int)lVar7;
  lVar7 = uVar6 + lVar7;
  iVar1 = (this->stride_).current_size_;
  iVar11 = 0;
  if (iVar1 < 1) {
LAB_004836ea:
    lVar8 = 0;
  }
  else {
    lVar8 = 0;
    do {
      puVar4 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->stride_,iVar11);
      lVar2 = 0x3f;
      if ((*puVar4 | 1) != 0) {
        for (; (*puVar4 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      lVar8 = lVar8 + (ulong)((int)lVar2 * 9 + 0x49U >> 6);
      iVar11 = iVar11 + 1;
    } while (iVar1 != iVar11);
    if (lVar8 == 0) goto LAB_004836ea;
    if ((int)(uint)lVar8 < 0) {
      uVar6 = 0xc;
    }
    else {
      uVar3 = (uint)lVar8 | 1;
      iVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 2);
    }
    lVar7 = lVar7 + uVar6;
  }
  this->_stride_cached_byte_size_ = (int)lVar8;
  lVar7 = lVar7 + lVar8;
  iVar1 = (this->dilationfactor_).current_size_;
  iVar11 = 0;
  if (iVar1 < 1) {
LAB_0048375a:
    lVar8 = 0;
  }
  else {
    lVar8 = 0;
    do {
      puVar4 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->dilationfactor_,iVar11);
      lVar2 = 0x3f;
      if ((*puVar4 | 1) != 0) {
        for (; (*puVar4 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      lVar8 = lVar8 + (ulong)((int)lVar2 * 9 + 0x49U >> 6);
      iVar11 = iVar11 + 1;
    } while (iVar1 != iVar11);
    if (lVar8 == 0) goto LAB_0048375a;
    if ((int)(uint)lVar8 < 0) {
      uVar6 = 0xc;
    }
    else {
      uVar3 = (uint)lVar8 | 1;
      iVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 2);
    }
    lVar7 = lVar7 + uVar6;
  }
  this->_dilationfactor_cached_byte_size_ = (int)lVar8;
  lVar7 = lVar7 + lVar8;
  iVar1 = (this->outputshape_).current_size_;
  iVar11 = 0;
  if (0 < iVar1) {
    lVar8 = 0;
    do {
      puVar4 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->outputshape_,iVar11);
      lVar2 = 0x3f;
      if ((*puVar4 | 1) != 0) {
        for (; (*puVar4 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      lVar8 = lVar8 + (ulong)((int)lVar2 * 9 + 0x49U >> 6);
      iVar11 = iVar11 + 1;
    } while (iVar1 != iVar11);
    if (lVar8 != 0) {
      if ((int)(uint)lVar8 < 0) {
        uVar6 = 0xc;
      }
      else {
        uVar3 = (uint)lVar8 | 1;
        iVar1 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
          }
        }
        uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 2);
      }
      lVar7 = lVar7 + uVar6;
      goto LAB_004837d7;
    }
  }
  lVar8 = 0;
LAB_004837d7:
  this->_outputshape_cached_byte_size_ = (int)lVar8;
  sVar10 = lVar7 + lVar8;
  if (this->weights_ != (WeightParams *)0x0 &&
      this != (ConvolutionLayerParams *)&_ConvolutionLayerParams_default_instance_) {
    sVar5 = WeightParams::ByteSizeLong(this->weights_);
    uVar3 = (uint)sVar5 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar10 = sVar10 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  if (this->bias_ != (WeightParams *)0x0 &&
      this != (ConvolutionLayerParams *)&_ConvolutionLayerParams_default_instance_) {
    sVar5 = WeightParams::ByteSizeLong(this->bias_);
    uVar3 = (uint)sVar5 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar10 = sVar10 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  if (this->outputchannels_ != 0) {
    uVar6 = this->outputchannels_ | 1;
    lVar7 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    sVar10 = sVar10 + ((int)lVar7 * 9 + 0x49U >> 6) + 1;
  }
  if (this->kernelchannels_ != 0) {
    uVar6 = this->kernelchannels_ | 1;
    lVar7 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    sVar10 = sVar10 + ((int)lVar7 * 9 + 0x49U >> 6) + 1;
  }
  if (this->ngroups_ != 0) {
    uVar6 = this->ngroups_ | 1;
    lVar7 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    sVar10 = sVar10 + ((int)lVar7 * 9 + 0x49U >> 6) + 1;
  }
  sVar5 = sVar10 + 3;
  if (this->isdeconvolution_ == false) {
    sVar5 = sVar10;
  }
  sVar10 = sVar5 + 3;
  if (this->hasbias_ == false) {
    sVar10 = sVar5;
  }
  if (this->_oneof_case_[0] == 0x33) {
    uVar3 = ((this->ConvolutionPaddingType_).same_)->asymmetrymode_;
    if (uVar3 == 0) {
      uVar6 = 0;
    }
    else if ((int)uVar3 < 0) {
      uVar6 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    ((this->ConvolutionPaddingType_).same_)->_cached_size_ = (int)uVar6;
    sVar10 = sVar10 + uVar6 + 3;
  }
  else if (this->_oneof_case_[0] == 0x32) {
    sVar5 = ValidPadding::ByteSizeLong((this->ConvolutionPaddingType_).valid_);
    uVar3 = (uint)sVar5 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar10 = sVar10 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  this->_cached_size_ = (int)sVar10;
  return sVar10;
}

Assistant:

size_t ConvolutionLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ConvolutionLayerParams)
  size_t total_size = 0;

  // repeated uint64 kernelSize = 20;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->kernelsize_);
    if (data_size > 0) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _kernelsize_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated uint64 stride = 30;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->stride_);
    if (data_size > 0) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _stride_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated uint64 dilationFactor = 40;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->dilationfactor_);
    if (data_size > 0) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _dilationfactor_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated uint64 outputShape = 100;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->outputshape_);
    if (data_size > 0) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _outputshape_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.WeightParams weights = 90;
  if (this->has_weights()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->weights_);
  }

  // .CoreML.Specification.WeightParams bias = 91;
  if (this->has_bias()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->bias_);
  }

  // uint64 outputChannels = 1;
  if (this->outputchannels() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->outputchannels());
  }

  // uint64 kernelChannels = 2;
  if (this->kernelchannels() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->kernelchannels());
  }

  // uint64 nGroups = 10;
  if (this->ngroups() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->ngroups());
  }

  // bool isDeconvolution = 60;
  if (this->isdeconvolution() != 0) {
    total_size += 2 + 1;
  }

  // bool hasBias = 70;
  if (this->hasbias() != 0) {
    total_size += 2 + 1;
  }

  switch (ConvolutionPaddingType_case()) {
    // .CoreML.Specification.ValidPadding valid = 50;
    case kValid: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ConvolutionPaddingType_.valid_);
      break;
    }
    // .CoreML.Specification.SamePadding same = 51;
    case kSame: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ConvolutionPaddingType_.same_);
      break;
    }
    case CONVOLUTIONPADDINGTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}